

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

_Bool Curl_creader_is_paused(Curl_easy *data)

{
  _Bool _Var1;
  Curl_creader *pCVar2;
  
  pCVar2 = (data->req).reader_stack;
  if (pCVar2 == (Curl_creader *)0x0) {
    _Var1 = false;
  }
  else {
    do {
      _Var1 = (*pCVar2->crt->is_paused)(data,pCVar2);
      if (_Var1) {
        return _Var1;
      }
      pCVar2 = pCVar2->next;
    } while (pCVar2 != (Curl_creader *)0x0);
  }
  return _Var1;
}

Assistant:

bool Curl_creader_is_paused(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;

  while(reader) {
    if(reader->crt->is_paused(data, reader))
      return TRUE;
    reader = reader->next;
  }
  return FALSE;
}